

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O2

void V_SetBlend(int blendr,int blendg,int blendb,int blenda)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  ulong uVar1;
  
  if ((BlendA != 0 || blenda != 0) &&
     ((((BlendA != blenda || (BlendR != blendr)) || (BlendG != blendg)) || (BlendB != blendb)))) {
    uVar1 = (ulong)(blendb & 0xffU | (blendg & 0xffU) << 8 | (blendr & 0xffU) << 0x10);
    UNRECOVERED_JUMPTABLE =
         (screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1e];
    BlendR = blendr;
    BlendG = blendg;
    BlendB = blendb;
    BlendA = blenda;
    (*UNRECOVERED_JUMPTABLE)(screen,uVar1,(ulong)(uint)blenda,blenda,uVar1,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void V_SetBlend (int blendr, int blendg, int blendb, int blenda)
{
	// Don't do anything if the new blend is the same as the old
	if (((blenda|BlendA) == 0) ||
		(blendr == BlendR &&
		 blendg == BlendG &&
		 blendb == BlendB &&
		 blenda == BlendA))
		return;

	V_ForceBlend (blendr, blendg, blendb, blenda);
}